

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::scrollTo(Picker *this,int index)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int i;
  QPersistentModelIndex top;
  QModelIndex mi;
  
  iVar3 = count(this);
  pPVar1 = (this->d).d;
  if (pPVar1->itemsCount < iVar3) {
    pQVar2 = pPVar1->model;
    iVar3 = pPVar1->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&top,&pPVar1->root);
    (**(code **)(*(long *)pQVar2 + 0x60))(&mi,pQVar2,index,iVar3,(QModelIndex *)&top);
    QPersistentModelIndex::QPersistentModelIndex(&top,&mi);
    for (iVar3 = 0; pPVar1 = (this->d).d, iVar3 < pPVar1->itemsCount / 2; iVar3 = iVar3 + 1) {
      PickerPrivate::makePrevIndex(pPVar1,&top);
    }
    QPersistentModelIndex::operator=(&pPVar1->topItemIndex,&top);
    ((this->d).d)->drawItemOffset = 0;
    QWidget::update();
    QPersistentModelIndex::~QPersistentModelIndex(&top);
  }
  return;
}

Assistant:

void
Picker::scrollTo( int index )
{
	if( count() > d->itemsCount )
	{
		QModelIndex mi = d->model->index( index, d->modelColumn, d->root );
		QPersistentModelIndex top = mi;

		for( int i = 0; i < d->itemsCount / 2; ++i )
			d->makePrevIndex( top );

		d->topItemIndex = top;
		d->drawItemOffset = 0;

		update();
	}
}